

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O2

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_10;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(uVar2,&req,getnameinfo_req,&addr4,0);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uStack_10 = 0x3f;
    }
    else {
      pcVar3 = "r == 0";
      uStack_10 = 0x3b;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_10 = 0x34;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT(r == 0);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}